

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::php::EnumOrMessageSuffix_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field,bool is_descriptor)

{
  long lVar1;
  Descriptor *desc;
  long *plVar2;
  EnumDescriptor *desc_00;
  undefined8 *puVar3;
  _func_void_FieldDescriptor_ptr *p_Var4;
  size_type *psVar5;
  _func_void_FieldDescriptor_ptr *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  undefined1 local_40 [32];
  
  if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
    local_60 = FieldDescriptor::TypeOnceInit;
    local_40._0_8_ = this;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(this + 0x30),&local_60,(FieldDescriptor **)local_40);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4) == 10) {
    desc = FieldDescriptor::message_type((FieldDescriptor *)this);
    DescriptorFullName<google::protobuf::Descriptor>((string *)local_40,desc,SUB81(field,0));
    plVar2 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x3a2cd4);
    local_60 = (_func_void_FieldDescriptor_ptr *)&local_50;
    p_Var4 = (_func_void_FieldDescriptor_ptr *)(plVar2 + 2);
    if ((_func_void_FieldDescriptor_ptr *)*plVar2 == p_Var4) {
      local_50 = *(long *)p_Var4;
      lStack_48 = plVar2[3];
    }
    else {
      local_50 = *(long *)p_Var4;
      local_60 = (_func_void_FieldDescriptor_ptr *)*plVar2;
    }
    local_58 = plVar2[1];
    *plVar2 = (long)p_Var4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  }
  else {
    if (*(once_flag **)(this + 0x30) != (once_flag *)0x0) {
      local_60 = FieldDescriptor::TypeOnceInit;
      local_40._0_8_ = this;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(this + 0x30),&local_60,(FieldDescriptor **)local_40);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(this + 0x38) * 4) != 8) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
      return __return_storage_ptr__;
    }
    desc_00 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    DescriptorFullName<google::protobuf::EnumDescriptor>((string *)local_40,desc_00,SUB81(field,0));
    puVar3 = (undefined8 *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x3a2cd4);
    local_60 = (_func_void_FieldDescriptor_ptr *)&local_50;
    p_Var4 = (_func_void_FieldDescriptor_ptr *)(puVar3 + 2);
    if ((_func_void_FieldDescriptor_ptr *)*puVar3 == p_Var4) {
      local_50 = *(long *)p_Var4;
      lStack_48 = puVar3[3];
    }
    else {
      local_50 = *(long *)p_Var4;
      local_60 = (_func_void_FieldDescriptor_ptr *)*puVar3;
    }
    local_58 = puVar3[1];
    *puVar3 = p_Var4;
    puVar3[1] = 0;
    *(undefined1 *)(puVar3 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_60);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar5) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_60 != (_func_void_FieldDescriptor_ptr *)&local_50) {
    operator_delete(local_60);
  }
  if ((php *)local_40._0_8_ != (php *)(local_40 + 0x10)) {
    operator_delete((void *)local_40._0_8_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EnumOrMessageSuffix(
    const FieldDescriptor* field, bool is_descriptor) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return ", '" + DescriptorFullName(field->message_type(), is_descriptor) + "'";
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    return ", '" + DescriptorFullName(field->enum_type(), is_descriptor) + "'";
  }
  return "";
}